

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O2

Instance * get_headless_instance(Instance *__return_storage_ptr__,uint32_t minor_version)

{
  VkDebugUtilsMessengerEXT pVVar1;
  VkAllocationCallbacks *pVVar2;
  PFN_vkGetInstanceProcAddr p_Var3;
  PFN_vkGetDeviceProcAddr p_Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  undefined6 uVar8;
  InstanceBuilder *pIVar9;
  Instance *pIVar10;
  StringRef capturedExpression;
  StringRef macroName;
  SourceLineInfo local_150;
  Result<vkb::Instance> instance_ret;
  AssertionHandler catchAssertionHandler;
  
  vkb::InstanceBuilder::InstanceBuilder((InstanceBuilder *)&catchAssertionHandler);
  pIVar9 = vkb::InstanceBuilder::request_validation_layers
                     ((InstanceBuilder *)&catchAssertionHandler,true);
  pIVar9 = vkb::InstanceBuilder::require_api_version(pIVar9,1,minor_version,0);
  pIVar9 = vkb::InstanceBuilder::set_headless(pIVar9,true);
  vkb::InstanceBuilder::build(&instance_ret,pIVar9);
  vkb::InstanceBuilder::InstanceInfo::~InstanceInfo((InstanceInfo *)&catchAssertionHandler);
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock_setup.cpp"
  ;
  local_150.line = 0xc;
  capturedExpression.m_size = 0x18;
  capturedExpression.m_start = "instance_ret.has_value()";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_150,capturedExpression,Normal);
  local_150.file = (char *)CONCAT71(local_150.file._1_7_,instance_ret.m_init);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  pIVar10 = vkb::Result<vkb::Instance>::value(&instance_ret);
  pVVar1 = pIVar10->debug_messenger;
  pVVar2 = pIVar10->allocation_callbacks;
  p_Var3 = pIVar10->fp_vkGetInstanceProcAddr;
  p_Var4 = pIVar10->fp_vkGetDeviceProcAddr;
  uVar5 = pIVar10->instance_version;
  uVar6 = pIVar10->api_version;
  __return_storage_ptr__->instance = pIVar10->instance;
  __return_storage_ptr__->debug_messenger = pVVar1;
  __return_storage_ptr__->allocation_callbacks = pVVar2;
  __return_storage_ptr__->fp_vkGetInstanceProcAddr = p_Var3;
  __return_storage_ptr__->fp_vkGetDeviceProcAddr = p_Var4;
  __return_storage_ptr__->instance_version = uVar5;
  __return_storage_ptr__->api_version = uVar6;
  bVar7 = pIVar10->properties2_ext_enabled;
  uVar8 = *(undefined6 *)&pIVar10->field_0x32;
  __return_storage_ptr__->headless = pIVar10->headless;
  __return_storage_ptr__->properties2_ext_enabled = bVar7;
  *(undefined6 *)&__return_storage_ptr__->field_0x32 = uVar8;
  return __return_storage_ptr__;
}

Assistant:

vkb::Instance get_headless_instance(uint32_t minor_version) {
    auto instance_ret =
        vkb::InstanceBuilder().request_validation_layers().require_api_version(1, minor_version).set_headless().build();
    REQUIRE(instance_ret.has_value());
    return instance_ret.value();
}